

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImGuiTable *pIVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  ImGuiWindowStackData *pIVar5;
  ImGuiColorMod *pIVar6;
  char *pcVar7;
  
  pIVar4 = GImGui;
  while( true ) {
    pIVar1 = pIVar4->CurrentTable;
    pIVar2 = pIVar4->CurrentWindow;
    if ((pIVar1 == (ImGuiTable *)0x0) ||
       ((pIVar1->OuterWindow != pIVar2 && (pIVar1->InnerWindow != pIVar2)))) break;
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                      pIVar1->OuterWindow->Name);
    }
    EndTable();
  }
  pIVar5 = ImVector<ImGuiWindowStackData>::back(&pIVar4->CurrentWindowStack);
  if (pIVar2 == (ImGuiWindow *)0x0) {
    __assert_fail("window != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x2226,"void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback, void *)");
  }
  while (pIVar4->CurrentTabBar != (ImGuiTabBar *)0x0) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar2->Name);
    }
    EndTabBar();
  }
  while (0 < (pIVar2->DC).TreeDepth) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar2->Name);
    }
    TreePop();
  }
  while ((int)(pIVar5->StackSizesOnBegin).SizeOfGroupStack < (pIVar4->GroupStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar2->Name);
    }
    EndGroup();
  }
  while (1 < (pIVar2->IDStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar2->Name);
    }
    PopID();
  }
  while ((pIVar5->StackSizesOnBegin).SizeOfDisabledStack < pIVar4->DisabledStackSize) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndDisabled() in \'%s\'",pIVar2->Name);
    }
    EndDisabled();
  }
  while ((int)(pIVar5->StackSizesOnBegin).SizeOfColorStack < (pIVar4->ColorStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      pcVar3 = pIVar2->Name;
      pIVar6 = ImVector<ImGuiColorMod>::back(&pIVar4->ColorStack);
      pcVar7 = GetStyleColorName(pIVar6->Col);
      (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",
                      pcVar3,pcVar7);
    }
    PopStyleColor(1);
  }
  while ((int)(pIVar5->StackSizesOnBegin).SizeOfItemFlagsStack < (pIVar4->ItemFlagsStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopItemFlag() in \'%s\'",pIVar2->Name);
    }
    PopItemFlag();
  }
  while ((int)(pIVar5->StackSizesOnBegin).SizeOfStyleVarStack < (pIVar4->StyleVarStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar2->Name);
    }
    PopStyleVar(1);
  }
  while ((int)(pIVar5->StackSizesOnBegin).SizeOfFocusScopeStack < (pIVar4->FocusScopeStack).Size) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar2->Name);
    }
    PopFocusScope();
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    ImGuiContext& g = *GImGui;
    while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
        EndTable();
    }

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackSizes* stack_sizes = &g.CurrentWindowStack.back().StackSizesOnBegin;
    IM_ASSERT(window != NULL);
    while (g.CurrentTabBar != NULL) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
        EndTabBar();
    }
    while (window->DC.TreeDepth > 0)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
        TreePop();
    }
    while (g.GroupStack.Size > stack_sizes->SizeOfGroupStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
        EndGroup();
    }
    while (window->IDStack.Size > 1)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
        PopID();
    }
    while (g.DisabledStackSize > stack_sizes->SizeOfDisabledStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndDisabled() in '%s'", window->Name);
        EndDisabled();
    }
    while (g.ColorStack.Size > stack_sizes->SizeOfColorStack)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
        PopStyleColor();
    }
    while (g.ItemFlagsStack.Size > stack_sizes->SizeOfItemFlagsStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopItemFlag() in '%s'", window->Name);
        PopItemFlag();
    }
    while (g.StyleVarStack.Size > stack_sizes->SizeOfStyleVarStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
        PopStyleVar();
    }
    while (g.FocusScopeStack.Size > stack_sizes->SizeOfFocusScopeStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
        PopFocusScope();
    }
}